

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O1

Data2D<int> *
TasGrid::HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)4>
          (Data2D<int> *__return_storage_ptr__,MultiIndexSet *mset)

{
  pointer piVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  int *piVar9;
  unsigned_long __n2;
  size_t __n;
  uint uVar10;
  pointer __src;
  vector<int,_std::allocator<int>_> dad;
  allocator_type local_79;
  vector<int,_std::allocator<int>_> *local_78;
  Data2D<int> *local_70;
  vector<int,_std::allocator<int>_> local_68;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  __n = mset->num_dimensions;
  sVar6 = (size_t)mset->cache_num_indexes;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  sVar8 = (size_t)((int)__n * 2);
  __return_storage_ptr__->stride = sVar8;
  __return_storage_ptr__->num_strips = sVar6;
  local_78 = &__return_storage_ptr__->vec;
  local_70 = __return_storage_ptr__;
  ::std::vector<int,_std::allocator<int>_>::vector
            (local_78,sVar8 * sVar6,(value_type_conflict3 *)&local_68,&local_79);
  if (0 < (long)sVar6) {
    local_48 = __n * 4;
    sVar8 = 0;
    local_40 = sVar6;
    local_38 = __n;
    do {
      __src = (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + mset->num_dimensions * sVar8;
      ::std::vector<int,_std::allocator<int>_>::vector(&local_68,__n,&local_79);
      local_50 = sVar8;
      if (__n != 0) {
        memmove((void *)CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_4_),__src,local_48);
        lVar7 = local_70->stride * local_50;
        piVar1 = (local_70->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar6 = 0;
        do {
          piVar9 = (int *)CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._0_4_);
          if (1 < piVar9[sVar6]) {
            uVar10 = __src[sVar6];
            uVar3 = uVar10 + 1 >> 1;
            if ((int)uVar10 < 2) {
              uVar3 = 0xffffffff;
            }
            piVar9[sVar6] = uVar3;
            iVar4 = MultiIndexSet::getSlot(mset,piVar9);
            piVar1[lVar7 + sVar6 * 2] = iVar4;
            piVar9 = (int *)CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_);
            puVar5 = (uint *)(piVar9 + sVar6);
            uVar3 = *puVar5;
            if (iVar4 == -1 && 1 < (int)*puVar5) {
              do {
                uVar10 = uVar3;
                *puVar5 = uVar10 + 1 >> 1;
                iVar4 = MultiIndexSet::getSlot(mset,piVar9);
                piVar1[lVar7 + sVar6 * 2] = iVar4;
                piVar9 = (int *)CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_68.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_);
                puVar5 = (uint *)(piVar9 + sVar6);
                if (iVar4 != -1) break;
                uVar3 = piVar9[sVar6];
              } while (1 < piVar9[sVar6]);
            }
            *puVar5 = -(uint)(uVar10 != 2);
            if (uVar10 == 2) {
              iVar4 = MultiIndexSet::getSlot(mset,piVar9);
              piVar1[lVar7 + sVar6 * 2 + 1] = iVar4;
            }
            *(int *)(CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + sVar6 * 4) = __src[sVar6];
            __n = local_38;
          }
          sVar6 = sVar6 + 1;
        } while (sVar6 != __n);
      }
      pvVar2 = (void *)CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
      }
      sVar8 = local_50 + 1;
    } while (sVar8 != local_40);
  }
  return local_70;
}

Assistant:

Data2D<int> computeDAGup(MultiIndexSet const &mset){
    size_t num_dimensions = mset.getNumDimensions();
    int num_points = mset.getNumIndexes();
    if (RuleLocal::getMaxNumParents<effrule>() > 1){ // allow for multiple parents and level 0 may have more than one node
        int max_parents = RuleLocal::getMaxNumParents<effrule>() * (int) num_dimensions;
        Data2D<int> parents(max_parents, num_points, -1);
        int level0_offset = RuleLocal::getNumPoints<effrule>(0);
        #pragma omp parallel for schedule(static)
        for(int i=0; i<num_points; i++){
            const int *p = mset.getIndex(i);
            std::vector<int> dad(num_dimensions);
            std::copy_n(p, num_dimensions, dad.data());
            int *pp = parents.getStrip(i);
            for(size_t j=0; j<num_dimensions; j++){
                if (dad[j] >= level0_offset){
                    int current = p[j];
                    dad[j] = RuleLocal::getParent<effrule>(current);
                    pp[2*j] = mset.getSlot(dad);
                    while ((dad[j] >= level0_offset) && (pp[2*j] == -1)){
                        current = dad[j];
                        dad[j] = RuleLocal::getParent<effrule>(current);
                        pp[2*j] = mset.getSlot(dad);
                    }
                    dad[j] = RuleLocal::getStepParent<effrule>(current);
                    if (dad[j] != -1){
                        pp[2*j + 1] = mset.getSlot(dad);
                    }
                    dad[j] = p[j];
                }
            }
        }
        return parents;
    }else{ // this assumes that level zero has only one node
        Data2D<int> parents((int) num_dimensions, num_points);
        #pragma omp parallel for schedule(static)
        for(int i=0; i<num_points; i++){
            const int *p = mset.getIndex(i);
            std::vector<int> dad(num_dimensions);
            std::copy_n(p, num_dimensions, dad.data());
            int *pp = parents.getStrip(i);
            for(size_t j=0; j<num_dimensions; j++){
                if (dad[j] == 0){
                    pp[j] = -1;
                }else{
                    dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                    pp[j] = mset.getSlot(dad.data());
                    while((dad[j] != 0) && (pp[j] == -1)){
                        dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                        pp[j] = mset.getSlot(dad);
                    }
                    dad[j] = p[j];
                }
            }
        }
        return parents;
    }
}